

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void AddVisibilityCompileOption
               (string *flags,cmGeneratorTarget *target,cmLocalGenerator *lg,string *lang,
               string *warnCMP0063)

{
  int iVar1;
  cmMakefile *this;
  char *__s;
  ostream *poVar2;
  string *psVar3;
  allocator<char> local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string option;
  undefined1 local_270 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  char *prop;
  string flagDefine;
  char *opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string compileOption;
  string *warnCMP0063_local;
  string *lang_local;
  cmLocalGenerator *lg_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  
  compileOption.field_2._8_8_ = warnCMP0063;
  std::operator+(&local_70,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,"_COMPILE_OPTIONS_VISIBILITY");
  std::__cxx11::string::~string((string *)&local_70);
  this = cmLocalGenerator::GetMakefile(lg);
  __s = cmMakefile::GetDefinition(this,(string *)local_50);
  if (__s == (char *)0x0) {
    flagDefine.field_2._12_4_ = 1;
    goto LAB_00190547;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,lang,
                 "_VISIBILITY_PRESET");
  local_b8 = cmGeneratorTarget::GetProperty(target,(string *)&prop);
  if (local_b8 == (char *)0x0) {
    flagDefine.field_2._12_4_ = 1;
  }
  else if (compileOption.field_2._8_8_ == 0) {
    iVar1 = strcmp(local_b8,"hidden");
    if (iVar1 != 0) {
      iVar1 = strcmp(local_b8,"default");
      if (iVar1 != 0) {
        iVar1 = strcmp(local_b8,"protected");
        if (iVar1 != 0) {
          iVar1 = strcmp(local_b8,"internal");
          if (iVar1 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
            poVar2 = std::operator<<((ostream *)local_270,"Target ");
            psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
            poVar2 = std::operator<<(poVar2,(string *)psVar3);
            poVar2 = std::operator<<(poVar2," uses unsupported value \"");
            poVar2 = std::operator<<(poVar2,local_b8);
            poVar2 = std::operator<<(poVar2,"\" for ");
            poVar2 = std::operator<<(poVar2,(string *)&prop);
            poVar2 = std::operator<<(poVar2,".");
            std::operator<<(poVar2,
                            " The supported values are: default, hidden, protected, and internal.");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error((string *)((long)&option.field_2 + 8));
            std::__cxx11::string::~string((string *)(option.field_2._M_local_buf + 8));
            flagDefine.field_2._12_4_ = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
            goto LAB_0019053b;
          }
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,__s,&local_2d1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   &local_2d0,local_b8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    (*lg->_vptr_cmLocalGenerator[6])(lg,flags,local_2b0);
    std::__cxx11::string::~string((string *)local_2b0);
    flagDefine.field_2._12_4_ = 0;
  }
  else {
    std::operator+(&local_f8,"  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop);
    std::operator+(&local_d8,&local_f8,"\n");
    std::__cxx11::string::operator+=((string *)compileOption.field_2._8_8_,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    flagDefine.field_2._12_4_ = 1;
  }
LAB_0019053b:
  std::__cxx11::string::~string((string *)&prop);
LAB_00190547:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

static void AddVisibilityCompileOption(std::string& flags,
                                       cmGeneratorTarget const* target,
                                       cmLocalGenerator* lg,
                                       const std::string& lang,
                                       std::string* warnCMP0063)
{
  std::string compileOption = "CMAKE_" + lang + "_COMPILE_OPTIONS_VISIBILITY";
  const char* opt = lg->GetMakefile()->GetDefinition(compileOption);
  if (!opt) {
    return;
  }
  std::string flagDefine = lang + "_VISIBILITY_PRESET";

  const char* prop = target->GetProperty(flagDefine);
  if (!prop) {
    return;
  }
  if (warnCMP0063) {
    *warnCMP0063 += "  " + flagDefine + "\n";
    return;
  }
  if (strcmp(prop, "hidden") != 0 && strcmp(prop, "default") != 0 &&
      strcmp(prop, "protected") != 0 && strcmp(prop, "internal") != 0) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " uses unsupported value \"" << prop
      << "\" for " << flagDefine << "."
      << " The supported values are: default, hidden, protected, and "
         "internal.";
    cmSystemTools::Error(e.str());
    return;
  }
  std::string option = std::string(opt) + prop;
  lg->AppendFlags(flags, option);
}